

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsClient.cpp
# Opt level: O3

int xs::runClient(int argc,char **argv)

{
  char *str;
  deBool dVar1;
  int iVar2;
  char *str_00;
  char *str_01;
  char *str_02;
  char *str_03;
  char *str_04;
  char *str_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this;
  ulong uVar3;
  Client client;
  CommandLine cmdLine;
  undefined1 local_f8 [32];
  undefined1 local_d8 [16];
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  de::SocketAddress::SocketAddress((SocketAddress *)local_d8);
  local_d8._8_8_ = &local_c0;
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0._M_allocated_capacity = (size_type)&local_a0;
  local_b0._8_8_ = 0;
  local_a0._M_local_buf[0] = '\0';
  local_90._M_allocated_capacity = (size_type)&local_80;
  local_90._8_8_ = 0;
  local_80._M_local_buf[0] = '\0';
  local_70._M_allocated_capacity = (size_type)&local_60;
  local_70._8_8_ = 0;
  local_60._M_local_buf[0] = '\0';
  local_50._M_allocated_capacity = (size_type)&local_40;
  local_50._8_8_ = (char *)0x0;
  local_40._M_local_buf[0] = '\0';
  de::SocketAddress::setHost((SocketAddress *)local_d8,"127.0.0.1");
  de::SocketAddress::setPort((SocketAddress *)local_d8,0xc360);
  std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)local_50._8_8_,0x10a16d);
  if (1 < argc) {
    uVar3 = 1;
    do {
      str = argv[uVar3];
      dVar1 = deStringBeginsWith(str,"--port=");
      if (dVar1 == 0) {
        dVar1 = deStringBeginsWith(str,"--host=");
        if (dVar1 == 0) {
          dVar1 = deStringBeginsWith(str,"--program=");
          if (dVar1 == 0) {
            dVar1 = deStringBeginsWith(str,"--params=");
            if (dVar1 == 0) {
              dVar1 = deStringBeginsWith(str,"--workdir=");
              if (dVar1 == 0) {
                dVar1 = deStringBeginsWith(str,"--caselist=");
                if (dVar1 == 0) {
                  dVar1 = deStringBeginsWith(str,"--out=");
                  if (dVar1 == 0) {
                    printHelp(*argv);
                    iVar2 = -1;
                    goto LAB_001071b6;
                  }
                  parseString_abi_cxx11_((string *)local_f8,(xs *)(str + 6),str_05);
                  this = &local_50;
                }
                else {
                  parseString_abi_cxx11_((string *)local_f8,(xs *)(str + 0xb),str_04);
                  this = &local_70;
                }
              }
              else {
                parseString_abi_cxx11_((string *)local_f8,(xs *)(str + 10),str_03);
                this = &local_90;
              }
            }
            else {
              parseString_abi_cxx11_((string *)local_f8,(xs *)(str + 9),str_02);
              this = &local_b0;
            }
          }
          else {
            parseString_abi_cxx11_((string *)local_f8,(xs *)(str + 10),str_01);
            this = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_d8 + 8);
          }
          std::__cxx11::string::operator=((string *)this->_M_local_buf,(string *)local_f8);
          if ((CommandLine *)local_f8._0_8_ != (CommandLine *)(local_f8 + 0x10)) {
            operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
          }
        }
        else {
          parseString_abi_cxx11_((string *)local_f8,(xs *)(str + 7),str_00);
          de::SocketAddress::setHost((SocketAddress *)local_d8,(char *)local_f8._0_8_);
          if ((CommandLine *)local_f8._0_8_ != (CommandLine *)(local_f8 + 0x10)) {
            operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
          }
        }
      }
      else {
        iVar2 = atoi(str + 7);
        de::SocketAddress::setPort((SocketAddress *)local_d8,iVar2);
      }
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
  }
  local_f8._0_8_ = local_d8;
  de::Socket::Socket((Socket *)(local_f8 + 8));
  Client::run((Client *)local_f8);
  de::Socket::~Socket((Socket *)(local_f8 + 8));
  iVar2 = 0;
LAB_001071b6:
  CommandLine::~CommandLine((CommandLine *)local_d8);
  return iVar2;
}

Assistant:

int runClient (int argc, const char* const* argv)
{
	CommandLine cmdLine;

	// Defaults.
	cmdLine.address.setHost("127.0.0.1");
	cmdLine.address.setPort(50016);
	cmdLine.dstFileName = "TestResults.qpa";

	// Parse command line.
	for (int argNdx = 1; argNdx < argc; argNdx++)
	{
		const char* arg = argv[argNdx];

		if (deStringBeginsWith(arg, "--port="))
			cmdLine.address.setPort(atoi(arg+7));
		else if (deStringBeginsWith(arg, "--host="))
			cmdLine.address.setHost(parseString(arg+7).c_str());
		else if (deStringBeginsWith(arg, "--program="))
			cmdLine.program = parseString(arg+10);
		else if (deStringBeginsWith(arg, "--params="))
			cmdLine.params = parseString(arg+9);
		else if (deStringBeginsWith(arg, "--workdir="))
			cmdLine.workingDir = parseString(arg+10);
		else if (deStringBeginsWith(arg, "--caselist="))
			cmdLine.caseList = parseString(arg+11);
		else if  (deStringBeginsWith(arg, "--out="))
			cmdLine.dstFileName = parseString(arg+6);
		else
		{
			printHelp(argv[0]);
			return -1;
		}
	}

	// Run client.
	try
	{
		Client client(cmdLine);
		client.run();
	}
	catch (const std::exception& e)
	{
		printf("%s\n", e.what());
		return -1;
	}

	return 0;
}